

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O2

U32 ZSTD_insertBt1(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,U32 mls,int extDict)

{
  BYTE *pBVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  uint *puVar9;
  char cVar10;
  uint uVar11;
  uint *puVar12;
  uint uVar13;
  uint uVar14;
  BYTE *pBVar15;
  int iVar16;
  bool bVar17;
  int local_b4;
  uint *local_b0;
  ulong local_a0;
  U32 dummy32;
  BYTE *local_80;
  BYTE *local_78;
  ulong local_70;
  ulong local_68;
  BYTE *local_60;
  BYTE *local_58;
  BYTE *local_50;
  U32 *local_48;
  ulong local_40;
  ulong local_38;
  
  cVar10 = (char)(ms->cParams).hashLog;
  switch(mls) {
  case 5:
    lVar5 = -0x30e4432345000000;
    break;
  case 6:
    lVar5 = -0x30e4432340650000;
    break;
  case 7:
    lVar5 = -0x30e44323405a9d00;
    break;
  case 8:
    lVar5 = -0x30e44323485a9b9d;
    break;
  default:
    uVar6 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-cVar10 & 0x1fU));
    goto LAB_001fda10;
  }
  uVar6 = (ulong)(lVar5 * *(long *)ip) >> (-cVar10 & 0x3fU);
LAB_001fda10:
  local_48 = ms->chainTable;
  uVar14 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  uVar4 = ms->hashTable[uVar6];
  local_80 = (ms->window).base;
  local_50 = (ms->window).dictBase;
  local_70 = (ulong)(ms->window).dictLimit;
  local_58 = local_50 + local_70;
  local_60 = local_80 + local_70;
  uVar13 = (int)ip - (int)local_80;
  local_68 = (ulong)uVar13;
  local_40 = 0;
  uVar11 = uVar13 - uVar14;
  if (uVar13 < uVar14) {
    uVar11 = 0;
  }
  uVar2 = (ms->window).lowLimit;
  uVar3 = (ms->cParams).searchLog;
  ms->hashTable[uVar6] = uVar13;
  uVar6 = (ulong)((uVar13 & uVar14) * 2);
  local_b0 = local_48 + uVar6;
  puVar12 = local_48 + uVar6 + 1;
  iVar16 = 1 << ((byte)uVar3 & 0x1f);
  local_b4 = uVar13 + 9;
  local_a0 = 8;
  local_38 = 0;
  local_78 = ip;
  do {
    uVar6 = (ulong)uVar4;
    bVar17 = iVar16 == 0;
    iVar16 = iVar16 + -1;
    if ((bVar17) || (uVar4 < uVar2)) goto LAB_001fdc36;
    uVar8 = local_40;
    if (local_38 < local_40) {
      uVar8 = local_38;
    }
    if ((extDict == 0) || (local_70 <= uVar8 + uVar6)) {
      pBVar15 = local_80 + uVar6;
      sVar7 = ZSTD_count(local_78 + uVar8,pBVar15 + uVar8,iend);
      uVar8 = sVar7 + uVar8;
    }
    else {
      pBVar1 = local_50 + uVar6;
      sVar7 = ZSTD_count_2segments(local_78 + uVar8,pBVar1 + uVar8,iend,local_58,local_60);
      uVar8 = sVar7 + uVar8;
      pBVar15 = local_80 + uVar6;
      if (uVar8 + uVar6 < local_70) {
        pBVar15 = pBVar1;
      }
    }
    if ((local_a0 < uVar8) && (local_a0 = uVar8, local_b4 - uVar4 < uVar8)) {
      local_b4 = uVar4 + (int)uVar8;
    }
    if (local_78 + uVar8 == iend) goto LAB_001fdc36;
    puVar9 = local_48 + (uVar4 & uVar14) * 2;
    if (pBVar15[uVar8] < local_78[uVar8]) {
      *local_b0 = uVar4;
      if (uVar4 <= uVar11) {
        local_b0 = &dummy32;
LAB_001fdc36:
        *puVar12 = 0;
        *local_b0 = 0;
        uVar11 = (int)local_a0 - 0x180;
        uVar4 = 0xc0;
        if (uVar11 < 0xc0) {
          uVar4 = uVar11;
        }
        uVar11 = 0;
        if (0x180 < local_a0) {
          uVar11 = uVar4;
        }
        uVar4 = (local_b4 - (int)local_68) - 8;
        if (uVar4 < uVar11) {
          uVar4 = uVar11;
        }
        return uVar4;
      }
      puVar9 = puVar9 + 1;
      local_38 = uVar8;
      local_b0 = puVar9;
    }
    else {
      *puVar12 = uVar4;
      puVar12 = puVar9;
      local_40 = uVar8;
      if (uVar4 <= uVar11) {
        puVar12 = &dummy32;
        goto LAB_001fdc36;
      }
    }
    uVar4 = *puVar9;
  } while( true );
}

Assistant:

static U32 ZSTD_insertBt1(
                ZSTD_matchState_t* ms,
                const BYTE* const ip, const BYTE* const iend,
                U32 const mls, const int extDict)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32 matchIndex = hashTable[h];
    size_t commonLengthSmaller=0, commonLengthLarger=0;
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const U32 dictLimit = ms->window.dictLimit;
    const BYTE* const dictEnd = dictBase + dictLimit;
    const BYTE* const prefixStart = base + dictLimit;
    const BYTE* match;
    const U32 curr = (U32)(ip-base);
    const U32 btLow = btMask >= curr ? 0 : curr - btMask;
    U32* smallerPtr = bt + 2*(curr&btMask);
    U32* largerPtr  = smallerPtr + 1;
    U32 dummy32;   /* to be nullified at the end */
    U32 const windowLow = ms->window.lowLimit;
    U32 matchEndIdx = curr+8+1;
    size_t bestLength = 8;
    U32 nbCompares = 1U << cParams->searchLog;
#ifdef ZSTD_C_PREDICT
    U32 predictedSmall = *(bt + 2*((curr-1)&btMask) + 0);
    U32 predictedLarge = *(bt + 2*((curr-1)&btMask) + 1);
    predictedSmall += (predictedSmall>0);
    predictedLarge += (predictedLarge>0);
#endif /* ZSTD_C_PREDICT */

    DEBUGLOG(8, "ZSTD_insertBt1 (%u)", curr);

    assert(ip <= iend-8);   /* required for h calculation */
    hashTable[h] = curr;   /* Update Hash Table */

    assert(windowLow > 0);
    while (nbCompares-- && (matchIndex >= windowLow)) {
        U32* const nextPtr = bt + 2*(matchIndex & btMask);
        size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
        assert(matchIndex < curr);

#ifdef ZSTD_C_PREDICT   /* note : can create issues when hlog small <= 11 */
        const U32* predictPtr = bt + 2*((matchIndex-1) & btMask);   /* written this way, as bt is a roll buffer */
        if (matchIndex == predictedSmall) {
            /* no need to check length, result known */
            *smallerPtr = matchIndex;
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
            matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            predictedSmall = predictPtr[1] + (predictPtr[1]>0);
            continue;
        }
        if (matchIndex == predictedLarge) {
            *largerPtr = matchIndex;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
            predictedLarge = predictPtr[0] + (predictPtr[0]>0);
            continue;
        }
#endif

        if (!extDict || (matchIndex+matchLength >= dictLimit)) {
            assert(matchIndex+matchLength >= dictLimit);   /* might be wrong if actually extDict */
            match = base + matchIndex;
            matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
        } else {
            match = dictBase + matchIndex;
            matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
            if (matchIndex+matchLength >= dictLimit)
                match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
        }

        if (matchLength > bestLength) {
            bestLength = matchLength;
            if (matchLength > matchEndIdx - matchIndex)
                matchEndIdx = matchIndex + (U32)matchLength;
        }

        if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
            break;   /* drop , to guarantee consistency ; miss a bit of compression, but other solutions can corrupt tree */
        }

        if (match[matchLength] < ip[matchLength]) {  /* necessarily within buffer */
            /* match is smaller than current */
            *smallerPtr = matchIndex;             /* update smaller idx */
            commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            smallerPtr = nextPtr+1;               /* new "candidate" => larger than match, which was smaller than target */
            matchIndex = nextPtr[1];              /* new matchIndex, larger than previous and closer to current */
        } else {
            /* match is larger than current */
            *largerPtr = matchIndex;
            commonLengthLarger = matchLength;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
    }   }

    *smallerPtr = *largerPtr = 0;
    {   U32 positions = 0;
        if (bestLength > 384) positions = MIN(192, (U32)(bestLength - 384));   /* speed optimization */
        assert(matchEndIdx > curr + 8);
        return MAX(positions, matchEndIdx - (curr + 8));
    }
}